

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O2

void sha256_sw_write(BinarySink *bs,void *vp,size_t len)

{
  uint uVar1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  size_t t;
  long lVar3;
  uint uVar4;
  size_t t_2;
  ulong uVar5;
  uint32_t g;
  uint32_t local_194;
  uint32_t e;
  uint32_t a;
  uint32_t f;
  uint32_t c;
  uint32_t b;
  uint32_t d;
  undefined8 local_178;
  void *local_170;
  ulong local_168;
  uint32_t local_160;
  uint32_t local_15c;
  uint32_t local_158;
  uint32_t local_154 [4];
  uint32_t local_144;
  BinarySink **local_140;
  uint32_t w [64];
  
  local_140 = &bs[-4].binarysink_;
  local_178 = bs;
  while (len != 0) {
    uVar5 = 0x40 - (long)bs[-1].writefmtv;
    if (len < uVar5) {
      uVar5 = len;
    }
    local_170 = vp;
    local_168 = len;
    memcpy(bs[-1].writefmtv + (long)local_140,vp,uVar5);
    vp = (void *)((long)local_170 + uVar5);
    len = local_168 - uVar5;
    p_Var2 = local_178[-1].writefmtv;
    local_178[-1].writefmtv = p_Var2 + uVar5;
    local_178[-1].binarysink_ = (BinarySink *)((long)&(local_178[-1].binarysink_)->write + uVar5);
    bs = local_178;
    if (p_Var2 + uVar5 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40) {
      local_178[-1].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        uVar4 = *(uint *)((long)local_178 + lVar3 * 4 + -0x50);
        w[lVar3] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      for (lVar3 = 0x10; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        uVar4 = w[lVar3 + -2];
        uVar1 = *(uint *)((long)&local_178 + lVar3 * 4 + 4);
        w[lVar3] = (uVar4 >> 10 ^ (uVar4 << 0xd | uVar4 >> 0x13) ^ (uVar4 << 0xf | uVar4 >> 0x11)) +
                   local_154[lVar3] + *(int *)((long)&local_178 + lVar3 * 4) +
                   (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
      }
      a = *(uint32_t *)&local_178[-5].writefmtv;
      b = *(uint32_t *)((long)&local_178[-5].writefmtv + 4);
      c = *(uint32_t *)&local_178[-5].binarysink_;
      d = *(uint32_t *)((long)&local_178[-5].binarysink_ + 4);
      e = *(uint32_t *)&local_178[-4].write;
      f = *(uint32_t *)((long)&local_178[-4].write + 4);
      g = *(uint32_t *)&local_178[-4].writefmtv;
      local_194 = *(uint32_t *)((long)&local_178[-4].writefmtv + 4);
      local_170 = vp;
      local_168 = len;
      local_160 = a;
      local_15c = b;
      local_158 = c;
      local_154[0] = d;
      local_154[1] = e;
      local_154[2] = f;
      local_154[3] = g;
      local_144 = local_194;
      for (uVar5 = 0; bs = local_178, uVar5 < 0x40; uVar5 = uVar5 + 8) {
        uVar4 = (uint)uVar5;
        sha256_sw_round(uVar4,w,&a,&b,&c,&d,&e,&f,&g,&local_194);
        sha256_sw_round(uVar4 + 1,w,&local_194,&a,&b,&c,&d,&e,&f,&g);
        sha256_sw_round(uVar4 + 2,w,&g,&local_194,&a,&b,&c,&d,&e,&f);
        sha256_sw_round(uVar4 + 3,w,&f,&g,&local_194,&a,&b,&c,&d,&e);
        sha256_sw_round(uVar4 + 4,w,&e,&f,&g,&local_194,&a,&b,&c,&d);
        sha256_sw_round(uVar4 + 5,w,&d,&e,&f,&g,&local_194,&a,&b,&c);
        sha256_sw_round(uVar4 + 6,w,&c,&d,&e,&f,&g,&local_194,&a,&b);
        sha256_sw_round(uVar4 + 7,w,&b,&c,&d,&e,&f,&g,&local_194,&a);
      }
      *(uint32_t *)&local_178[-5].writefmtv = local_160 + a;
      *(uint32_t *)((long)&local_178[-5].writefmtv + 4) = local_15c + b;
      *(uint32_t *)&local_178[-5].binarysink_ = local_158 + c;
      *(uint32_t *)((long)&local_178[-5].binarysink_ + 4) = local_154[0] + d;
      *(uint32_t *)&local_178[-4].write = local_154[1] + e;
      *(uint32_t *)((long)&local_178[-4].write + 4) = local_154[2] + f;
      *(uint32_t *)&local_178[-4].writefmtv = local_154[3] + g;
      *(uint32_t *)((long)&local_178[-4].writefmtv + 4) = local_144 + local_194;
      smemclr(w,0x100);
      len = local_168;
      vp = local_170;
    }
  }
  return;
}

Assistant:

static void sha256_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha256_sw *s = BinarySink_DOWNCAST(bs, sha256_sw);

    while (len > 0)
        if (sha256_block_write(&s->blk, &vp, &len))
            sha256_sw_block(s->core, s->blk.block);
}